

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobject.h
# Opt level: O2

void GC::Mark<PType>(PType **obj)

{
  anon_union_8_2_947301c6 anon_var_0;
  PType *local_18;
  
  local_18 = *obj;
  Mark((DObject **)&local_18);
  *obj = local_18;
  return;
}

Assistant:

void Mark(T *&obj)
	{
		union
		{
			T *t;
			DObject *o;
		};
		o = obj;
		Mark(&o);
		obj = t;
	}